

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::SetReferencedPropertyIdWithMapIndex
          (FunctionBody *this,uint mapIndex,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  int *piVar5;
  
  if (propertyId < 0x2d9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fa,"(propertyId >= TotalNumberOfBuiltInProperties)",
                                "propertyId >= TotalNumberOfBuiltInProperties");
    if (!bVar2) goto LAB_006cfdb8;
    *puVar4 = 0;
  }
  uVar3 = GetReferencedPropertyIdCount(this);
  if (uVar3 <= mapIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fb,"(mapIndex < this->GetReferencedPropertyIdCount())",
                                "mapIndex < this->GetReferencedPropertyIdCount()");
    if (!bVar2) goto LAB_006cfdb8;
    *puVar4 = 0;
  }
  piVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  if (piVar5 == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fc,"(this->GetReferencedPropertyIdMap() != nullptr)",
                                "this->GetReferencedPropertyIdMap() != nullptr");
    if (!bVar2) goto LAB_006cfdb8;
    *puVar4 = 0;
  }
  piVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  if (piVar5[mapIndex] != -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fd,
                                "(this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty)"
                                ,
                                "this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty"
                               );
    if (!bVar2) {
LAB_006cfdb8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  piVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  piVar5[mapIndex] = propertyId;
  return;
}

Assistant:

void FunctionBody::SetReferencedPropertyIdWithMapIndex(uint mapIndex, PropertyId propertyId)
    {
        Assert(propertyId >= TotalNumberOfBuiltInProperties);
        Assert(mapIndex < this->GetReferencedPropertyIdCount());
        Assert(this->GetReferencedPropertyIdMap() != nullptr);
        Assert(this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty);
        this->GetReferencedPropertyIdMap()[mapIndex] = propertyId;
    }